

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O0

void VP8CodeIntraModes(VP8Encoder *enc)

{
  int iVar1;
  long in_RDI;
  uint8_t *probas;
  int left;
  int y;
  int x;
  uint8_t *top_pred;
  int preds_w;
  uint8_t *preds;
  VP8MBInfo *mb;
  VP8EncIterator it;
  VP8BitWriter *bw;
  int in_stack_fffffffffffff0a8;
  int in_stack_fffffffffffff0ac;
  VP8Encoder *in_stack_fffffffffffff0b0;
  uint local_f44;
  int local_f40;
  int local_f3c;
  long local_f38;
  long local_f28;
  long local_ed8;
  
  VP8IteratorInit(in_stack_fffffffffffff0b0,
                  (VP8EncIterator *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8));
  do {
    local_f28 = local_ed8;
    if (*(int *)(in_RDI + 0x24) != 0) {
      PutSegment((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
                 (uint8_t *)0x17a8a5);
    }
    if (*(int *)(in_RDI + 0x5bcc) != 0) {
      VP8PutBit((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
                in_stack_fffffffffffff0a8);
    }
    iVar1 = VP8PutBit((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
                      in_stack_fffffffffffff0a8);
    if (iVar1 == 0) {
      iVar1 = *(int *)(in_RDI + 0x38);
      local_f38 = local_ed8 - iVar1;
      for (local_f40 = 0; local_f40 < 4; local_f40 = local_f40 + 1) {
        local_f44 = (uint)*(byte *)(local_f28 + -1);
        for (local_f3c = 0; local_f3c < 4; local_f3c = local_f3c + 1) {
          in_stack_fffffffffffff0b0 =
               (VP8Encoder *)(kBModesProba[*(byte *)(local_f38 + local_f3c)] + (int)local_f44);
          local_f44 = PutI4Mode((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac,
                                (uint8_t *)0x17a9cd);
        }
        local_f38 = local_f28;
        local_f28 = local_f28 + iVar1;
      }
    }
    else {
      PutI16Mode((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac);
    }
    PutUVMode((VP8BitWriter *)in_stack_fffffffffffff0b0,in_stack_fffffffffffff0ac);
    iVar1 = VP8IteratorNext((VP8EncIterator *)0x17aa34);
  } while (iVar1 != 0);
  return;
}

Assistant:

void VP8CodeIntraModes(VP8Encoder* const enc) {
  VP8BitWriter* const bw = &enc->bw_;
  VP8EncIterator it;
  VP8IteratorInit(enc, &it);
  do {
    const VP8MBInfo* const mb = it.mb_;
    const uint8_t* preds = it.preds_;
    if (enc->segment_hdr_.update_map_) {
      PutSegment(bw, mb->segment_, enc->proba_.segments_);
    }
    if (enc->proba_.use_skip_proba_) {
      VP8PutBit(bw, mb->skip_, enc->proba_.skip_proba_);
    }
    if (VP8PutBit(bw, (mb->type_ != 0), 145)) {  // i16x16
      PutI16Mode(bw, preds[0]);
    } else {
      const int preds_w = enc->preds_w_;
      const uint8_t* top_pred = preds - preds_w;
      int x, y;
      for (y = 0; y < 4; ++y) {
        int left = preds[-1];
        for (x = 0; x < 4; ++x) {
          const uint8_t* const probas = kBModesProba[top_pred[x]][left];
          left = PutI4Mode(bw, preds[x], probas);
        }
        top_pred = preds;
        preds += preds_w;
      }
    }
    PutUVMode(bw, mb->uv_mode_);
  } while (VP8IteratorNext(&it));
}